

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLNode * __thiscall tinyxml2::XMLElement::ShallowClone(XMLElement *this,XMLDocument *doc)

{
  int iVar1;
  undefined4 extraout_var;
  XMLElement *this_00;
  char *pcVar2;
  char *str;
  XMLAttribute *pXVar3;
  XMLAttribute *pXVar4;
  
  if (doc == (XMLDocument *)0x0) {
    doc = (this->super_XMLNode)._document;
  }
  iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pcVar2 = StrPair::GetStr(&(this->super_XMLNode)._value);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  this_00 = XMLDocument::NewElement(doc,pcVar2);
  for (pXVar4 = this->_rootAttribute; pXVar4 != (XMLAttribute *)0x0; pXVar4 = pXVar4->_next) {
    pcVar2 = StrPair::GetStr(&pXVar4->_name);
    str = StrPair::GetStr(&pXVar4->_value);
    pXVar3 = FindOrCreateAttribute(this_00,pcVar2);
    StrPair::SetStr(&pXVar3->_value,str,0);
  }
  return &this_00->super_XMLNode;
}

Assistant:

XMLNode* XMLElement::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLElement* element = doc->NewElement( Value() );					// fixme: this will always allocate memory. Intern?
    for( const XMLAttribute* a=FirstAttribute(); a; a=a->Next() ) {
        element->SetAttribute( a->Name(), a->Value() );					// fixme: this will always allocate memory. Intern?
    }
    return element;
}